

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O2

uint8_t * __thiscall DTSStreamReader::findFrame(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint8_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t *p_buf;
  ulong uVar5;
  uint64_t local_38;
  
  while (uVar5 = (long)end - (long)buff, 0xf < (long)uVar5) {
    local_38 = *(uint64_t *)buff;
    uVar2 = my_ntohll(&local_38);
    local_38 = *(uint64_t *)((long)buff + 8);
    uVar3 = my_ntohll(&local_38);
    uVar4 = uVar3 + 0x10;
    if (0x2000000000000000 < uVar4) break;
    if (uVar2 == 0x415550522d484452) {
      if (end < (uint64_t *)(uVar4 + (long)buff)) {
        return (uint8_t *)0x0;
      }
      this->m_skippingSamples =
           (uint)(ushort)(*(ushort *)((long)buff + 0x23) << 8 | *(ushort *)((long)buff + 0x23) >> 8)
      ;
      buff = (uint8_t *)(uVar4 + (long)buff);
    }
    else {
      if ((((((uVar2 != 0x41555052494e464f) && (uVar2 != 0x4249545348565442)) &&
            (uVar2 != 0x424c41434b4f5554)) &&
           ((uVar2 != 0x4252414e43485054 && (uVar2 != 0x4255494c44564552)))) &&
          (uVar2 != 0x434f524553534d44)) &&
         (((uVar2 != 0x4454534844484452 && (uVar2 != 0x45585453535f4d44)) &&
          ((uVar2 != 0x46494c45494e464f &&
           ((uVar2 != 0x4e4156492d54424c && (uVar2 != 0x54494d45434f4445)))))))) {
        if (uVar2 == 0x5354524d44415441) {
          buff = (uint8_t *)((long)buff + 0x10);
        }
        break;
      }
      buff = (uint8_t *)((long)buff + uVar4);
      if (uVar5 < uVar4) {
        return (uint8_t *)0x0;
      }
    }
  }
  if (this->m_firstCall == true) {
    this->m_firstCall = false;
    checkIfOnlyHDDataExists(this,buff,end);
  }
  if (this->m_isCoreExists == false) {
    for (; buff < end + -4; buff = (uint8_t *)((long)buff + 1)) {
      if (((((uint8_t)*(uint64_t *)buff == 'd') && (*(uint8_t *)((long)buff + 1) == 'X')) &&
          (*(uint8_t *)((long)buff + 2) == ' ')) && (*(uint8_t *)((long)buff + 3) == '%')) {
        return (uint8_t *)(uint64_t *)buff;
      }
    }
  }
  else {
    for (; buff < end + -4; buff = (uint8_t *)((long)buff + 1)) {
      uVar1 = (uint8_t)*(uint64_t *)buff;
      if (buff < end + -6) {
        if (uVar1 == '\x1f') {
          if (((*(uint8_t *)((long)buff + 1) == 0xff) && (*(uint8_t *)((long)buff + 2) == 0xe8)) &&
             ((*(uint8_t *)((long)buff + 3) == '\0' &&
              ((*(uint8_t *)((long)buff + 4) == '\a' && (0xef < *(byte *)((long)buff + 5))))))) {
            return (uint8_t *)(uint64_t *)buff;
          }
        }
        else if ((((uVar1 != '\x7f') && (uVar1 != 0xfe)) && (uVar1 == 0xff)) &&
                (((*(uint8_t *)((long)buff + 1) == '\x1f' && (*(uint8_t *)((long)buff + 2) == '\0'))
                 && ((*(uint8_t *)((long)buff + 3) == 0xe8 &&
                     ((0xef < *(byte *)((long)buff + 4) && (*(uint8_t *)((long)buff + 5) == '\a'))))
                    )))) {
          return (uint8_t *)(uint64_t *)buff;
        }
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* DTSStreamReader::findFrame(uint8_t* buff, uint8_t* end)
{
    // check for DTS-HD headers
    while (end - buff >= 16)
    {
        const auto ptr = reinterpret_cast<int64_t*>(buff);
        const uint64_t hdrType = my_ntohll(ptr[0]);
        const uint64_t hdrSize = my_ntohll(ptr[1]) + 16;

        if (hdrSize > static_cast<uint64_t>(1) << 61)
            break;

        if (hdrType == AUPRINFO || hdrType == BITSHVTB || hdrType == BLACKOUT || hdrType == BRANCHPT ||
            hdrType == BUILDVER || hdrType == CORESSMD || hdrType == EXTSS_MD || hdrType == FILEINFO ||
            hdrType == NAVI_TBL || hdrType == TIMECODE || hdrType == DTSHDHDR)
        {
            if (hdrSize > static_cast<size_t>(end - buff))
                return nullptr;  // need more data
            buff += hdrSize;
        }
        else if (hdrType == AUPR_HDR)
        {
            if (buff + hdrSize > end)
                return nullptr;  // need more data
            // determine skipping frames amount
            m_skippingSamples = (buff[35] << 8) + buff[36];
            buff += hdrSize;
        }
        else if (hdrType == STRMDATA)
        {
            // m_dataSegmentLen = hdrSize;
            buff += 16;
            break;
        }
        else
        {
            break;  // no more HD headers
        }
    }

    if (m_firstCall)
    {
        m_firstCall = false;
        checkIfOnlyHDDataExists(buff, end);
    }

    if (!m_isCoreExists)
    {
        // if not core exists find HD frames directly
        for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
        {
            if (p_buf[0] == 0x64 && p_buf[1] == 0x58 && p_buf[2] == 0x20 && p_buf[3] == 0x25)
            {
                return p_buf;
            }
        }
        return nullptr;
    }

    for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
    {
        if (p_buf < end - 6)
        {
            if (p_buf[0] == 0xff && p_buf[1] == 0x1f && p_buf[2] == 0x00 && p_buf[3] == 0xe8 &&
                (p_buf[4] & 0xf0) == 0xf0 && p_buf[5] == 0x07)
            {
                return p_buf;
            }
            // 14 bits, big endian version of the bitstream
            if (p_buf[0] == 0x1f && p_buf[1] == 0xff && p_buf[2] == 0xe8 && p_buf[3] == 0x00 && p_buf[4] == 0x07 &&
                (p_buf[5] & 0xf0) == 0xf0)
            {
                return p_buf;
            }
        }
        // 16 bits, big endian version of the bitstream
        if (p_buf[0] == 0x7f && p_buf[1] == 0xfe && p_buf[2] == 0x80 && p_buf[3] == 0x01)
        {
            return p_buf;
        }
        // 16 bits, little endian version of the bitstream
        if (p_buf[0] == 0xfe && p_buf[1] == 0x7f && p_buf[2] == 0x01 && p_buf[3] == 0x80)
        {
            return p_buf;
        }
    }
    return nullptr;
}